

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# container.cpp
# Opt level: O2

void __thiscall Container::setup_credentials(Container *this)

{
  __gid_t __rgid;
  __uid_t __ruid;
  int iVar1;
  ContextManager *pCVar2;
  string sStack_38;
  
  __rgid = this->id_;
  iVar1 = setresgid(__rgid,__rgid,__rgid);
  if (iVar1 != 0) {
    pCVar2 = ContextManager::get();
    format_abi_cxx11_(&sStack_38,"Setting process gid to %d failed: %m",(ulong)this->id_);
    (**pCVar2->_vptr_ContextManager)(pCVar2);
    std::__cxx11::string::~string((string *)&sStack_38);
  }
  iVar1 = setgroups(0,(__gid_t *)0x0);
  if (iVar1 != 0) {
    pCVar2 = ContextManager::get();
    format_abi_cxx11_(&sStack_38,"Removing process from all groups failed: %m");
    (**pCVar2->_vptr_ContextManager)(pCVar2,&sStack_38);
    std::__cxx11::string::~string((string *)&sStack_38);
  }
  __ruid = this->id_;
  iVar1 = setresuid(__ruid,__ruid,__ruid);
  if (iVar1 != 0) {
    pCVar2 = ContextManager::get();
    format_abi_cxx11_(&sStack_38,"Setting process uid to %d failed: %m",(ulong)this->id_);
    (**pCVar2->_vptr_ContextManager)(pCVar2,&sStack_38);
    std::__cxx11::string::~string((string *)&sStack_38);
  }
  iVar1 = setpgrp();
  if (iVar1 != 0) {
    pCVar2 = ContextManager::get();
    format_abi_cxx11_(&sStack_38,"Setting process group id failed: %m");
    (**pCVar2->_vptr_ContextManager)(pCVar2,&sStack_38);
    std::__cxx11::string::~string((string *)&sStack_38);
  }
  return;
}

Assistant:

void Container::setup_credentials() {
    if (setresgid(id_, id_, id_) != 0) {
        die(format("Setting process gid to %d failed: %m", id_));
    }
    if (setgroups(0, nullptr) != 0) {
        die(format("Removing process from all groups failed: %m"));
    }
    if (setresuid(id_, id_, id_) != 0) {
        die(format("Setting process uid to %d failed: %m", id_));
    }
    if (setpgrp() != 0) {
        die(format("Setting process group id failed: %m"));
    }
}